

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibration.cpp
# Opt level: O2

void savePoints(int status,void *data)

{
  ostream *poVar1;
  int i;
  long lVar2;
  ofstream output;
  
  std::ofstream::ofstream(&output,(string *)&calibrationFile_abi_cxx11_,_S_out);
  poVar1 = std::operator<<((ostream *)&std::cout,"New points saved: \n");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&output,calibrationFirstArray[lVar2].x);
    poVar1 = std::operator<<(poVar1,";");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,calibrationFirstArray[lVar2].y);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,calibrationFirstArray[lVar2].x);
    poVar1 = std::operator<<(poVar1,";");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,calibrationFirstArray[lVar2].y);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::ostream::flush();
  std::ofstream::close();
  updateSize();
  std::ofstream::~ofstream(&output);
  return;
}

Assistant:

void savePoints(int status, void* data){
    ofstream output(calibrationFile);
    cout<<"New points saved: \n"<<endl;
    for(int i=0; i<4; i++) {
        output << calibrationFirstArray[i].x << ";" << calibrationFirstArray[i].y << endl;
        cout<< calibrationFirstArray[i].x << ";" << calibrationFirstArray[i].y << endl;
    }
    output.flush();
    output.close();

    updateSize();
}